

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void YUY2ToUVRow_SSE2(uint8_t *src_yuy2,int stride_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  long lVar16;
  int iVar17;
  char cVar26;
  ushort uVar18;
  byte bVar28;
  ushort uVar27;
  undefined4 uVar19;
  byte bVar30;
  ushort uVar29;
  byte bVar32;
  ushort uVar31;
  byte bVar34;
  ushort uVar33;
  byte bVar36;
  ushort uVar35;
  byte bVar38;
  ushort uVar37;
  byte bVar40;
  ushort uVar39;
  char cVar42;
  ushort uVar41;
  byte bVar44;
  ushort uVar43;
  byte bVar46;
  ushort uVar45;
  byte bVar48;
  ushort uVar47;
  byte bVar50;
  ushort uVar49;
  byte bVar52;
  ushort uVar51;
  byte bVar54;
  ushort uVar53;
  byte bVar56;
  ushort uVar55;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined6 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [16];
  
  lVar16 = (long)dst_v - (long)dst_u;
  do {
    auVar25 = *(undefined1 (*) [16])src_yuy2;
    auVar3 = *(undefined1 (*) [16])((long)src_yuy2 + 0x10);
    puVar1 = *(undefined1 (*) [16])src_yuy2 + stride_yuy2;
    puVar2 = *(undefined1 (*) [16])((long)src_yuy2 + 0x10) + stride_yuy2;
    src_yuy2 = (uint8_t *)((long)src_yuy2 + 0x20);
    pavgb(auVar25[0],*puVar1);
    cVar26 = pavgb(auVar25[1],puVar1[1]);
    auVar14._1_14_ = auVar25._2_14_;
    auVar14[0] = cVar26;
    pavgb(auVar25[2],puVar1[2]);
    bVar28 = pavgb(auVar25[3],puVar1[3]);
    pavgb(auVar25[4],puVar1[4]);
    bVar30 = pavgb(auVar25[5],puVar1[5]);
    pavgb(auVar25[6],puVar1[6]);
    bVar32 = pavgb(auVar25[7],puVar1[7]);
    pavgb(auVar25[8],puVar1[8]);
    bVar34 = pavgb(auVar25[9],puVar1[9]);
    pavgb(auVar25[10],puVar1[10]);
    bVar36 = pavgb(auVar25[0xb],puVar1[0xb]);
    pavgb(auVar25[0xc],puVar1[0xc]);
    bVar38 = pavgb(auVar25[0xd],puVar1[0xd]);
    pavgb(auVar25[0xe],puVar1[0xe]);
    bVar40 = pavgb(auVar25[0xf],puVar1[0xf]);
    pavgb(auVar3[0],*puVar2);
    cVar42 = pavgb(auVar3[1],puVar2[1]);
    auVar15._1_14_ = auVar3._2_14_;
    auVar15[0] = cVar42;
    pavgb(auVar3[2],puVar2[2]);
    bVar44 = pavgb(auVar3[3],puVar2[3]);
    pavgb(auVar3[4],puVar2[4]);
    bVar46 = pavgb(auVar3[5],puVar2[5]);
    pavgb(auVar3[6],puVar2[6]);
    bVar48 = pavgb(auVar3[7],puVar2[7]);
    pavgb(auVar3[8],puVar2[8]);
    bVar50 = pavgb(auVar3[9],puVar2[9]);
    pavgb(auVar3[10],puVar2[10]);
    bVar52 = pavgb(auVar3[0xb],puVar2[0xb]);
    pavgb(auVar3[0xc],puVar2[0xc]);
    bVar54 = pavgb(auVar3[0xd],puVar2[0xd]);
    pavgb(auVar3[0xe],puVar2[0xe]);
    bVar56 = pavgb(auVar3[0xf],puVar2[0xf]);
    uVar18 = auVar14._0_2_ & 0xff;
    uVar27 = (ushort)(((uint)bVar28 << 0x18) >> 0x18);
    uVar29 = (ushort)(((uint6)bVar30 << 0x28) >> 0x28);
    uVar31 = (ushort)(((ulong)bVar32 << 0x38) >> 0x38);
    uVar33 = (ushort)((uint3)((uint3)bVar34 << 0x10) >> 0x10);
    uVar35 = (ushort)(((uint5)bVar36 << 0x20) >> 0x20);
    uVar37 = (ushort)(((uint7)bVar38 << 0x30) >> 0x30);
    uVar39 = (ushort)((uint3)((uint3)bVar40 << 0x10) >> 0x10);
    uVar41 = auVar15._0_2_ & 0xff;
    uVar43 = (ushort)(((uint)bVar44 << 0x18) >> 0x18);
    uVar45 = (ushort)(((uint6)bVar46 << 0x28) >> 0x28);
    uVar47 = (ushort)(((ulong)bVar48 << 0x38) >> 0x38);
    uVar49 = (ushort)((uint3)((uint3)bVar50 << 0x10) >> 0x10);
    uVar51 = (ushort)(((uint5)bVar52 << 0x20) >> 0x20);
    uVar53 = (ushort)(((uint7)bVar54 << 0x30) >> 0x30);
    uVar55 = (ushort)((uint3)((uint3)bVar56 << 0x10) >> 0x10);
    bVar28 = (uVar27 != 0) * (uVar27 < 0x100) * bVar28 - (0xff < uVar27);
    cVar5 = (uVar31 != 0) * (uVar31 < 0x100) * bVar32 - (0xff < uVar31);
    uVar19 = CONCAT13(cVar5,CONCAT12((uVar29 != 0) * (uVar29 < 0x100) * bVar30 - (0xff < uVar29),
                                     CONCAT11(bVar28,(cVar26 != '\0') * (uVar18 < 0x100) * cVar26 -
                                                     (0xff < uVar18))));
    cVar26 = (uVar35 != 0) * (uVar35 < 0x100) * bVar36 - (0xff < uVar35);
    uVar20 = CONCAT15(cVar26,CONCAT14((uVar33 != 0) * (uVar33 < 0x100) * bVar34 - (0xff < uVar33),
                                      uVar19));
    cVar6 = (uVar39 != 0) * (uVar39 < 0x100) * bVar40 - (0xff < uVar39);
    uVar21 = CONCAT17(cVar6,CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * bVar38 - (0xff < uVar37),
                                     uVar20));
    cVar7 = (uVar43 != 0) * (uVar43 < 0x100) * bVar44 - (0xff < uVar43);
    auVar22._0_10_ =
         CONCAT19(cVar7,CONCAT18((cVar42 != '\0') * (uVar41 < 0x100) * cVar42 - (0xff < uVar41),
                                 uVar21));
    auVar22[10] = (uVar45 != 0) * (uVar45 < 0x100) * bVar46 - (0xff < uVar45);
    cVar42 = (uVar47 != 0) * (uVar47 < 0x100) * bVar48 - (0xff < uVar47);
    auVar22[0xb] = cVar42;
    auVar23[0xc] = (uVar49 != 0) * (uVar49 < 0x100) * bVar50 - (0xff < uVar49);
    auVar23._0_12_ = auVar22;
    cVar8 = (uVar51 != 0) * (uVar51 < 0x100) * bVar52 - (0xff < uVar51);
    auVar23[0xd] = cVar8;
    auVar24[0xe] = (uVar53 != 0) * (uVar53 < 0x100) * bVar54 - (0xff < uVar53);
    auVar24._0_14_ = auVar23;
    cVar9 = (uVar55 != 0) * (uVar55 < 0x100) * bVar56 - (0xff < uVar55);
    auVar25[0xf] = cVar9;
    auVar25._0_15_ = auVar24;
    auVar13[8] = 0xff;
    auVar13._0_8_ = 0xff00ff00ff00ff;
    auVar13[9] = 0;
    auVar13[10] = 0xff;
    auVar13[0xb] = 0;
    auVar13[0xc] = 0xff;
    auVar13[0xd] = 0;
    auVar13[0xe] = 0xff;
    auVar24 = auVar24 & auVar13;
    uVar18 = auVar24._0_2_;
    uVar27 = auVar24._2_2_;
    uVar29 = auVar24._4_2_;
    uVar31 = auVar24._6_2_;
    sVar10 = auVar24._8_2_;
    sVar11 = auVar24._10_2_;
    sVar12 = auVar24._12_2_;
    bVar30 = auVar24[0xe];
    uVar33 = (ushort)bVar28;
    uVar35 = (ushort)((uint)uVar19 >> 0x18);
    uVar37 = (ushort)((uint6)uVar20 >> 0x28);
    uVar39 = (ushort)((ulong)uVar21 >> 0x38);
    uVar41 = (ushort)((unkuint10)auVar22._0_10_ >> 0x48);
    uVar43 = auVar22._10_2_ >> 8;
    uVar45 = auVar23._12_2_ >> 8;
    uVar47 = auVar25._14_2_ >> 8;
    *(ulong *)dst_u =
         CONCAT17((bVar30 != 0) * (bVar30 < 0x100) * bVar30 - (0xff < bVar30),
                  CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar24[0xc] - (0xff < sVar12),
                           CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar24[10] - (0xff < sVar11),
                                    CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar24[8] -
                                             (0xff < sVar10),
                                             CONCAT13((uVar31 != 0) * (uVar31 < 0x100) * auVar24[6]
                                                      - (0xff < uVar31),
                                                      CONCAT12((uVar29 != 0) * (uVar29 < 0x100) *
                                                               auVar24[4] - (0xff < uVar29),
                                                               CONCAT11((uVar27 != 0) *
                                                                        (uVar27 < 0x100) *
                                                                        auVar24[2] - (0xff < uVar27)
                                                                        ,(uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         auVar24[0] -
                                                                         (0xff < uVar18))))))));
    *(ulong *)(dst_u + lVar16) =
         CONCAT17((uVar47 != 0) * (uVar47 < 0x100) * cVar9 - (0xff < uVar47),
                  CONCAT16((uVar45 != 0) * (uVar45 < 0x100) * cVar8 - (0xff < uVar45),
                           CONCAT15((uVar43 != 0) * (uVar43 < 0x100) * cVar42 - (0xff < uVar43),
                                    CONCAT14((uVar41 != 0) * (uVar41 < 0x100) * cVar7 -
                                             (0xff < uVar41),
                                             CONCAT13((uVar39 != 0) * (uVar39 < 0x100) * cVar6 -
                                                      (0xff < uVar39),
                                                      CONCAT12((uVar37 != 0) * (uVar37 < 0x100) *
                                                               cVar26 - (0xff < uVar37),
                                                               CONCAT11((uVar35 != 0) *
                                                                        (uVar35 < 0x100) * cVar5 -
                                                                        (0xff < uVar35),
                                                                        (uVar33 != 0) *
                                                                        (uVar33 < 0x100) * bVar28 -
                                                                        (0xff < uVar33))))))));
    dst_u = dst_u + 8;
    iVar17 = width + -0x10;
    bVar4 = 0xf < width;
    width = iVar17;
  } while (iVar17 != 0 && bVar4);
  return;
}

Assistant:

void YUY2ToUVRow_SSE2(const uint8_t* src_yuy2,
                      int stride_yuy2,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $0x8,%%xmm5                   \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x00(%0,%4,1),%%xmm2          \n"
      "movdqu      0x10(%0,%4,1),%%xmm3          \n"
      "lea         0x20(%0),%0                   \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "pavgb       %%xmm3,%%xmm1                 \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movq        %%xmm1,0x00(%1,%2,1)          \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_yuy2),               // %0
        "+r"(dst_u),                  // %1
        "+r"(dst_v),                  // %2
        "+r"(width)                   // %3
      : "r"((intptr_t)(stride_yuy2))  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}